

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>,false>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Value VVar2;
  Simd<short,_(unsigned_char)__b_> result;
  Value local_28;
  undefined8 local_10;
  
  VVar2 = Pop(this);
  local_10 = VVar2._8_8_;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    *(short *)((long)&local_28 + lVar1 * 2) = (short)*(char *)((long)&local_10 + lVar1);
  }
  Push(this,local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}